

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

uint __thiscall QXmlStreamReaderPrivate::getChar_helper(QXmlStreamReaderPrivate *this)

{
  ArrayOptions *pAVar1;
  QString *this_00;
  QByteArray *other;
  Data *pDVar2;
  QIODevice *this_01;
  Interface *data;
  char16_t *pcVar3;
  qsizetype qVar4;
  QArrayData *data_00;
  ssize_t sVar5;
  optional<QStringConverter::Encoding> oVar6;
  Data *pDVar7;
  size_t in_RCX;
  long lVar8;
  uint uVar9;
  long in_FS_OFFSET;
  QByteArrayView data_01;
  QByteArrayView in;
  undefined1 local_68 [16];
  qsizetype qStack_58;
  undefined8 local_50;
  void *pvStack_48;
  void *local_40;
  ClearDataFn p_Stack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->characterOffset = this->characterOffset + this->readBufferPos;
  this->readBufferPos = 0;
  this_00 = &this->readBuffer;
  if ((this->readBuffer).d.size != 0) {
    QString::resize(this_00,0);
  }
  if ((this->decoder).super_QStringConverter.iface != (Interface *)0x0) {
    this->nbytesread = 0;
  }
  if (this->device == (QIODevice *)0x0) {
    other = &this->dataBuffer;
    if (this->nbytesread == 0) {
      QByteArray::operator=(&this->rawReadBuffer,other);
    }
    else {
      QByteArray::append(&this->rawReadBuffer,other);
    }
    this->nbytesread = (this->rawReadBuffer).d.size;
    QByteArray::clear(other);
    lVar8 = this->nbytesread;
  }
  else {
    QByteArray::resize(&this->rawReadBuffer,0x2000);
    pDVar2 = (this->rawReadBuffer).d.d;
    this_01 = this->device;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData(&this->rawReadBuffer,(this->rawReadBuffer).d.size,KeepSize);
    }
    sVar5 = QIODevice::read(this_01,(int)(this->rawReadBuffer).d.ptr + (int)this->nbytesread,
                            (void *)(0x2000 - this->nbytesread),in_RCX);
    lVar8 = 0;
    if (0 < sVar5) {
      lVar8 = sVar5;
    }
    lVar8 = lVar8 + this->nbytesread;
    this->nbytesread = lVar8;
  }
  if (lVar8 != 0) {
    if ((this->decoder).super_QStringConverter.iface == (Interface *)0x0) {
      if (lVar8 < 4) goto LAB_00395c40;
      data_01.m_data = (storage_type *)0x3c;
      data_01.m_size = (qsizetype)(this->rawReadBuffer).d.ptr;
      oVar6 = QStringConverter::encodingForData
                        ((QStringConverter *)(this->rawReadBuffer).d.size,data_01,(char16_t)lVar8);
      local_68._0_8_ =
           QStringConverter::encodingInterfaces +
           ((Encoding)
            (((long)oVar6.super__Optional_base<QStringConverter::Encoding,_true,_true>._M_payload.
                    super__Optional_payload_base<QStringConverter::Encoding> << 0x1f) >> 0x3f) &
           oVar6.super__Optional_base<QStringConverter::Encoding,_true,_true>._M_payload.
           super__Optional_payload_base<QStringConverter::Encoding>._M_payload);
      local_68._8_8_ = (char16_t *)0x0;
      qStack_58 = 0;
      local_50 = 0;
      pvStack_48 = (void *)0x0;
      local_40 = (void *)0x0;
      p_Stack_38 = (ClearDataFn)0x0;
      (this->decoder).super_QStringConverter.iface = (Interface *)local_68._0_8_;
      QStringConverterBase::State::clear(&(this->decoder).super_QStringConverter.state);
      (this->decoder).super_QStringConverter.state.flags.
      super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i = 0;
      (this->decoder).super_QStringConverter.state.remainingChars = 0;
      (this->decoder).super_QStringConverter.state.invalidChars = 0;
      (this->decoder).super_QStringConverter.state.field_4.d[0] = pvStack_48;
      (this->decoder).super_QStringConverter.state.field_4.d[1] = local_40;
      (this->decoder).super_QStringConverter.state.clearFn = p_Stack_38;
      p_Stack_38 = (ClearDataFn)0x0;
      QStringConverterBase::State::clear((State *)(local_68 + 8));
    }
    in.m_data = (this->rawReadBuffer).d.ptr;
    in.m_size = this->nbytesread;
    QStringDecoder::decodeAsString((QString *)local_68,&this->decoder,in);
    data = (Interface *)(this->readBuffer).d.d;
    pcVar3 = (this->readBuffer).d.ptr;
    (this->readBuffer).d.d = (Data *)local_68._0_8_;
    (this->readBuffer).d.ptr = (char16_t *)local_68._8_8_;
    qVar4 = (this->readBuffer).d.size;
    (this->readBuffer).d.size = qStack_58;
    local_68._0_8_ = data;
    local_68._8_8_ = pcVar3;
    qStack_58 = qVar4;
    if (data != (Interface *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&data->name)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&data->name)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&data->name)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)data,2,0x10);
      }
    }
    if (((this->field_0x3a9 & 8) != 0) &&
       ((this->decoder).super_QStringConverter.state.invalidChars != 0)) {
      uVar9 = 0xffffffff;
      QCoreApplication::translate
                ((QString *)local_68,"QXmlStream","Encountered incorrectly encoded content.",
                 (char *)0x0,-1);
      this->error = NotWellFormedError;
      QString::operator=(&this->errorString,(QString *)local_68);
      this->type = Invalid;
      if ((Interface *)local_68._0_8_ != (Interface *)0x0) {
        LOCK();
        *(int *)(char **)local_68._0_8_ = *(int *)(char **)local_68._0_8_ + -1;
        UNLOCK();
        if (*(int *)(char **)local_68._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        }
      }
      if ((this->readBuffer).d.ptr != (char16_t *)0x0) {
        data_00 = &((this_00->d).d)->super_QArrayData;
        (this_00->d).d = (Data *)0x0;
        (this->readBuffer).d.ptr = (char16_t *)0x0;
        (this->readBuffer).d.size = 0;
        if (data_00 != (QArrayData *)0x0) {
          LOCK();
          (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
               (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data_00,2,0x10);
          }
        }
      }
      goto LAB_00395c4c;
    }
    pDVar7 = (this_00->d).d;
    if ((pDVar7 == (Data *)0x0) ||
       ((1 < (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ||
        (lVar8 = (pDVar7->super_QArrayData).alloc,
        lVar8 - ((long)((long)(this->readBuffer).d.ptr -
                       ((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 1) < 2)))) {
      lVar8 = (this->readBuffer).d.size;
      QString::reallocData(this_00,lVar8 + (ulong)(lVar8 == 0),KeepSize);
      pDVar7 = (this->readBuffer).d.d;
      if (pDVar7 != (Data *)0x0) {
        lVar8 = (pDVar7->super_QArrayData).alloc;
        goto LAB_00395c0f;
      }
    }
    else {
LAB_00395c0f:
      if (lVar8 != 0) {
        pAVar1 = &(pDVar7->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    lVar8 = this->readBufferPos;
    if (lVar8 < (this->readBuffer).d.size) {
      this->readBufferPos = lVar8 + 1;
      uVar9 = (uint)(ushort)(this->readBuffer).d.ptr[lVar8];
      goto LAB_00395c4c;
    }
  }
LAB_00395c40:
  this->atEnd = true;
  uVar9 = 0xffffffff;
LAB_00395c4c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar9;
  }
  __stack_chk_fail();
}

Assistant:

uint QXmlStreamReaderPrivate::getChar_helper()
{
    constexpr qsizetype BUFFER_SIZE = 8192;
    characterOffset += readBufferPos;
    readBufferPos = 0;
    if (readBuffer.size())
        readBuffer.resize(0);
    if (decoder.isValid())
        nbytesread = 0;
    if (device) {
        rawReadBuffer.resize(BUFFER_SIZE);
        qint64 nbytesreadOrMinus1 = device->read(rawReadBuffer.data() + nbytesread, BUFFER_SIZE - nbytesread);
        nbytesread += qMax(nbytesreadOrMinus1, qint64{0});
    } else {
        if (nbytesread)
            rawReadBuffer += dataBuffer;
        else
            rawReadBuffer = dataBuffer;
        nbytesread = rawReadBuffer.size();
        dataBuffer.clear();
    }
    if (!nbytesread) {
        atEnd = true;
        return StreamEOF;
    }

    if (!decoder.isValid()) {
        if (nbytesread < 4) { // the 4 is to cover 0xef 0xbb 0xbf plus
                              // one extra for the utf8 codec
            atEnd = true;
            return StreamEOF;
        }
        auto encoding = QStringDecoder::encodingForData(rawReadBuffer, char16_t('<'));
        if (!encoding)
            // assume utf-8
            encoding = QStringDecoder::Utf8;
        decoder = QStringDecoder(*encoding);
    }

    readBuffer = decoder(QByteArrayView(rawReadBuffer).first(nbytesread));

    if (lockEncoding && decoder.hasError()) {
        raiseWellFormedError(QXmlStream::tr("Encountered incorrectly encoded content."));
        readBuffer.clear();
        return StreamEOF;
    }

    readBuffer.reserve(1); // keep capacity when calling resize() next time

    if (readBufferPos < readBuffer.size()) {
        ushort c = readBuffer.at(readBufferPos++).unicode();
        return c;
    }

    atEnd = true;
    return StreamEOF;
}